

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O1

String __thiscall Bstrlib::String::midString(String *this,int left,int len)

{
  int iVar1;
  int in_ECX;
  uchar *extraout_RDX;
  uchar *extraout_RDX_00;
  uchar *puVar2;
  undefined4 in_register_00000034;
  long lVar3;
  String SVar4;
  tagbstring t;
  tagbstring local_18;
  
  lVar3 = CONCAT44(in_register_00000034,left);
  if (in_ECX < 0) {
    iVar1 = *(int *)(lVar3 + 4);
    if (iVar1 == -in_ECX || SBORROW4(iVar1,-in_ECX) != iVar1 + in_ECX < 0) {
      len = 0;
    }
    else if (len < 0) {
      len = len + iVar1;
      if (len < 1) {
        len = 0;
      }
      in_ECX = (in_ECX + iVar1) - len;
    }
    else {
      in_ECX = in_ECX + iVar1;
    }
  }
  if (len < 0) {
    if (SBORROW4(in_ECX,-len) == in_ECX + len < 0) {
      in_ECX = -len;
    }
    len = len + *(int *)(lVar3 + 4);
  }
  local_18.slen = *(int *)(lVar3 + 4) - len;
  if (in_ECX < local_18.slen) {
    local_18.slen = in_ECX;
  }
  if ((len < 0) || (local_18.slen < 1)) {
    String(this,"");
    puVar2 = extraout_RDX_00;
  }
  else {
    local_18.mlen = -1;
    local_18.data = (uchar *)((ulong)(uint)len + *(long *)(lVar3 + 8));
    String(this,&local_18);
    puVar2 = extraout_RDX;
  }
  SVar4.super_tagbstring.data = puVar2;
  SVar4.super_tagbstring._0_8_ = this;
  return (String)SVar4.super_tagbstring;
}

Assistant:

const String String::midString(int left, int len) const
    {
        struct tagbstring t;
        if (len < 0)
        {   // Want data from the right of the string, without specifying the start point
            // For example String("abcdefgh").midString(0, -3) => "abcde"
            if (-len >= slen) left = 0;
            else
            {   // Check for String("abcdef").midString(-3, -1) => "de"
                if (left < 0) { left = max(0, slen + left); len = slen + len - left; }
                else len += slen;
            }
        }
        if (left < 0)
        {   // Want data from the right of the string
            len = len > -left ? -left : len;
            left = slen + left;
        }
        if (len > slen - left)    len = slen - left;
        if (len <= 0 || left < 0)    return String("");
        blk2tbstr(t, data + left, len);
        return String(t);
    }